

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O3

void __thiscall ninx::lexer::token::Variable::Variable(Variable *this,int line_number,string *name)

{
  pointer pcVar1;
  
  (this->super_Token).line_number = line_number;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Variable_0014fdb8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  this->trailing_spaces = 0;
  return;
}

Assistant:

ninx::lexer::token::Variable::Variable(int line_number, const std::string &name) : Token(line_number), name(name) {}